

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O1

QHostInfo __thiscall QHostInfoCache::get(QHostInfoCache *this,QString *name,bool *valid)

{
  char16_t **ppcVar1;
  char16_t *pcVar2;
  QHostInfoCacheElement *other;
  long lVar3;
  undefined1 *in_RCX;
  long lVar4;
  
  ppcVar1 = &name[3].d.ptr;
  if (name[3].d.ptr == (char16_t *)0x0) {
    LOCK();
    pcVar2 = *ppcVar1;
    if (pcVar2 == (char16_t *)0x0) {
      *ppcVar1 = (char16_t *)0x1;
    }
    UNLOCK();
    if (pcVar2 == (char16_t *)0x0) goto LAB_001b06fe;
  }
  QBasicMutex::lockInternal();
LAB_001b06fe:
  *in_RCX = 0;
  other = QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::relink
                    ((QCache<QString,_QHostInfoCache::QHostInfoCacheElement> *)&(name->d).ptr,
                     (QString *)valid);
  if (other == (QHostInfoCacheElement *)0x0) {
    QHostInfo::QHostInfo((QHostInfo *)this,-1);
  }
  else {
    lVar3 = QElapsedTimer::elapsed();
    lVar4 = (long)*(int *)&(name->d).d;
    if (SBORROW8(lVar3,lVar4 * 1000) != lVar3 + lVar4 * -1000 < 0) {
      *in_RCX = 1;
    }
    QHostInfo::QHostInfo((QHostInfo *)this,&other->info);
  }
  LOCK();
  pcVar2 = *ppcVar1;
  *ppcVar1 = (char16_t *)0x0;
  UNLOCK();
  if (pcVar2 != (char16_t *)0x1) {
    QBasicMutex::unlockInternalFutex(ppcVar1);
  }
  return (QHostInfo)(QHostInfoPrivate *)this;
}

Assistant:

QHostInfo QHostInfoCache::get(const QString &name, bool *valid)
{
    QMutexLocker locker(&this->mutex);

    *valid = false;
    if (QHostInfoCacheElement *element = cache.object(name)) {
        if (element->age.elapsed() < max_age*1000)
            *valid = true;
        return element->info;

        // FIXME idea:
        // if too old but not expired, trigger a new lookup
        // to freshen our cache
    }

    return QHostInfo();
}